

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

int dbg_print(int format,FILE *target,void *data,int len,int sep)

{
  char *in_RDX;
  FILE *in_RSI;
  undefined4 in_EDI;
  int cents;
  int dollars;
  int local_28;
  
  switch(in_EDI) {
  case 0:
    fprintf(in_RSI,"%s",in_RDX);
    break;
  case 2:
    fprintf(in_RSI,"%ld",in_RDX);
    break;
  case 3:
    fprintf(in_RSI,"%ld",*(undefined8 *)in_RDX);
    break;
  case 4:
    fprintf(in_RSI,"%ld",in_RDX);
    break;
  case 5:
    local_28 = (int)*(undefined8 *)in_RDX;
    if (local_28 < 0) {
      fprintf(in_RSI,"-");
      local_28 = -local_28;
    }
    fprintf(in_RSI,"%d.%02d",(ulong)(uint)(local_28 / 100),(ulong)(uint)(local_28 % 100));
    break;
  case 6:
    fprintf(in_RSI,"%c",(ulong)(uint)(int)*in_RDX);
  }
  fprintf(in_RSI,"%c",0x7c);
  return 0;
}

Assistant:

int
dbg_print(int format, FILE *target, void *data, int len, int sep)
{
	int dollars,
		cents;
#ifndef MVS
	UNUSED(len);
#endif

	switch(format)
	{
	case DT_STR:
#ifdef DOUBLE_QUOTE_OUTPUT_STRINGS
		fprintf(target, "\"%s\"", (char *)data);
#else
		fprintf(target, "%s", (char *)data);
#endif
		break;
#ifdef MVS
	case DT_VSTR:
		/* note: only used in MVS, assumes columnar output */
		fprintf(target, "%c%c%-*s", 
			(len >> 8) & 0xFF, len & 0xFF, len, (char *)data);
		break;
#endif /* MVS */
	case DT_INT:
		fprintf(target, "%ld", (long)((size_t)data));
		break;
	case DT_HUGE:
		fprintf(target, HUGE_FORMAT, *(DSS_HUGE *)data);
		break;
	case DT_KEY:
		fprintf(target, "%ld", (long)((size_t)data));
		break;
	case DT_MONEY:
		cents = (int)*(DSS_HUGE *)data;
		if (cents < 0)
			{
			fprintf(target, "-");
			cents = -cents;
			}
		dollars = cents / 100;
		cents %= 100;
		fprintf(target, "%d.%02d", dollars, cents);
		break;
	case DT_CHR:
		fprintf(target, "%c", *(char *)data);
		break;
	}

#ifdef EOL_HANDLING
	if (sep)
#else
	UNUSED(sep);
#endif /* EOL_HANDLING */
	fprintf(target, "%c", SEPARATOR);
	
	return(0);
}